

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

_List_iterator<cs_impl::any> __thiscall
cs_impl::
cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::_call<0>(cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *__args;
  _List_iterator<cs_impl::any> _Var1;
  
  __args = try_convert_and_check<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  _Var1 = std::
          function<std::_List_iterator<cs_impl::any>_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
          ::operator()(&this->mFunc,__args);
  return (_List_iterator<cs_impl::any>)_Var1._M_node;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}